

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecCorr.c
# Opt level: O1

void Gia_ManCorrPerformRemapping(Vec_Int_t *vPairs,Vec_Ptr_t *vInfo)

{
  uint uVar1;
  void **ppvVar2;
  int *piVar3;
  void *pvVar4;
  void *pvVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  
  if (1 < vInfo->nSize) {
    iVar9 = vPairs->nSize;
    if (0 < iVar9) {
      ppvVar2 = vInfo->pArray;
      piVar3 = vPairs->pArray;
      uVar6 = (uint)((ulong)((long)ppvVar2[1] - (long)*ppvVar2) >> 2);
      uVar8 = 0;
      do {
        if ((long)iVar9 <= (long)(uVar8 | 1)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar9 = piVar3[uVar8 | 1];
        if (((long)iVar9 < 0) || (vInfo->nSize <= iVar9)) goto LAB_006408fb;
        uVar1 = piVar3[uVar8];
        if (((int)uVar1 < 0) || (vInfo->nSize <= (int)uVar1)) goto LAB_006408fb;
        if (0 < (int)uVar6) {
          pvVar4 = ppvVar2[iVar9];
          pvVar5 = ppvVar2[uVar1];
          uVar7 = 0;
          do {
            if (*(int *)((long)pvVar4 + uVar7 * 4) != 0) {
              __assert_fail("pInfoObj[w] == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecCorr.c"
                            ,0x197,"void Gia_ManCorrPerformRemapping(Vec_Int_t *, Vec_Ptr_t *)");
            }
            *(undefined4 *)((long)pvVar4 + uVar7 * 4) = *(undefined4 *)((long)pvVar5 + uVar7 * 4);
            uVar7 = uVar7 + 1;
          } while ((uVar6 & 0x7fffffff) != uVar7);
        }
        uVar8 = uVar8 + 2;
        iVar9 = vPairs->nSize;
      } while ((int)uVar8 < iVar9);
    }
    return;
  }
LAB_006408fb:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

void Gia_ManCorrPerformRemapping( Vec_Int_t * vPairs, Vec_Ptr_t * vInfo )
{
    unsigned * pInfoObj, * pInfoRepr;
    int w, i, iObj, iRepr, nWords;
    nWords = Vec_PtrReadWordsSimInfo( vInfo );
    Vec_IntForEachEntry( vPairs, iRepr, i )
    {
        iObj = Vec_IntEntry( vPairs, ++i );
        pInfoObj = (unsigned *)Vec_PtrEntry( vInfo, iObj );
        pInfoRepr = (unsigned *)Vec_PtrEntry( vInfo, iRepr );
        for ( w = 0; w < nWords; w++ )
        {
            assert( pInfoObj[w] == 0 );
            pInfoObj[w] = pInfoRepr[w];
        }
    }
}